

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

void __thiscall CVmConsoleMain::CVmConsoleMain(CVmConsoleMain *this)

{
  undefined1 *puVar1;
  CVmBannerManager *this_00;
  CVmLogConsoleManager *this_01;
  CVmFormatterMain *this_02;
  CVmFormatterLog *this_03;
  
  (this->super_CVmConsole).command_nf_ = (CVmNetFile *)0x0;
  (this->super_CVmConsole).command_glob_ = (vm_globalvar_t *)0x0;
  (this->super_CVmConsole).script_sp_ = (script_stack_entry *)0x0;
  (this->super_CVmConsole).command_fp_ = (CVmDataSource *)0x0;
  (this->super_CVmConsole).log_str_ = (CVmFormatterLog *)0x0;
  (this->super_CVmConsole).field_0x18 = (this->super_CVmConsole).field_0x18 & 0xfc | 2;
  (this->super_CVmConsole)._vptr_CVmConsole = (_func_int **)&PTR_delete_obj_0035b200;
  this_00 = (CVmBannerManager *)operator_new(0x18);
  CVmBannerManager::CVmBannerManager(this_00);
  this->banner_manager_ = this_00;
  this_01 = (CVmLogConsoleManager *)operator_new(0x18);
  CVmLogConsoleManager::CVmLogConsoleManager(this_01);
  this->log_console_manager_ = this_01;
  this_02 = (CVmFormatterMain *)operator_new(0xf040);
  CVmFormatterMain::CVmFormatterMain(this_02,&this->super_CVmConsole,0x100);
  this->main_disp_str_ = this_02;
  (*(this_02->super_CVmFormatterDisp).super_CVmFormatter._vptr_CVmFormatter[1])(this_02);
  (this->super_CVmConsole).disp_str_ = (CVmFormatter *)this->main_disp_str_;
  this_03 = (CVmFormatterLog *)operator_new(0xf060);
  (this_03->super_CVmFormatter).console_ = &this->super_CVmConsole;
  (this_03->super_CVmFormatter).tabs_ = (CVmHashTable *)0x0;
  (this_03->super_CVmFormatter).cmap_ = (CCharmapToLocal *)0x0;
  (this_03->super_CVmFormatter).html_title_buf_ = (char *)0x0;
  (this_03->super_CVmFormatter).html_title_buf_size_ = 0;
  (this_03->super_CVmFormatter)._vptr_CVmFormatter = (_func_int **)&PTR_delete_obj_0035b470;
  this_03->logfp_ = (osfildef *)0x0;
  this_03->lognf_ = (CVmNetFile *)0x0;
  this_03->logglob_ = (vm_globalvar_t *)0x0;
  this_03->width_ = 0x50;
  (this->super_CVmConsole).log_str_ = this_03;
  CVmFormatter::set_charmap((CVmFormatter *)this_03,G_cmap_to_log_X);
  (*(((this->super_CVmConsole).log_str_)->super_CVmFormatter)._vptr_CVmFormatter[1])();
  puVar1 = &(this->super_CVmConsole).field_0x18;
  *puVar1 = *puVar1 | 1;
  this->statline_str_ = (CVmFormatterStatline *)0x0;
  S_read_in_progress = 0;
  S_read_buf[0] = '\0';
  return;
}

Assistant:

CVmConsoleMain::CVmConsoleMain(VMG0_)
{
    /* create the system banner manager */
    banner_manager_ = new CVmBannerManager();

    /* create the log console manager */
    log_console_manager_ = new CVmLogConsoleManager();

    /* create and initialize our display stream */
    main_disp_str_ = new CVmFormatterMain(this, 256);
    main_disp_str_->init();

    /* initially send text to the main display stream */
    disp_str_ = main_disp_str_;

    /* 
     *   Create our log stream.  The main console always has a log stream,
     *   even when it's not in use, so that we can keep the log stream's
     *   state synchronized with the display stream in preparation for
     *   activation.  
     */
    log_str_ = new CVmFormatterLog(this, 80);

    /* 
     *   use the default log file character mapper - on some systems, files
     *   don't use the same character set as the display 
     */
    log_str_->set_charmap(G_cmap_to_log);

    /* initialize the log stream */
    log_str_->init();

    /* 
     *   the log stream is initially enabled (this is separate from the log
     *   file being opened; it merely indicates that we send output
     *   operations to the log stream for processing) 
     */
    log_enabled_ = TRUE;

    /* we don't have a statusline formatter until asked for one */
    statline_str_ = 0;

    /* reset statics */
    S_read_in_progress = FALSE;
    S_read_buf[0] = '\0';
}